

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::operator++(BN *this)

{
  unsigned_short uVar1;
  pointer puVar2;
  unsigned_short *i;
  pointer puVar3;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  int local_c;
  
  puVar3 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (puVar3 == puVar2) {
      local_c = 1;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<int>
                (&this->ba,&local_c);
      return this;
    }
    *puVar3 = *puVar3 + 1;
    uVar1 = *puVar3;
    puVar3 = puVar3 + 1;
  } while (uVar1 == 0);
  return this;
}

Assistant:

BN & BN::operator ++()
{
    for (auto& i : ba) {
        ++i;
        if (i != 0)
            return *this;
    }
    ba.emplace_back(1);
    return *this;
}